

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint *
create_capture_parameter_constraint(char *parameter_name,void *capture_to,size_t size_to_capture)

{
  Constraint *pCVar1;
  size_t in_RDX;
  void *in_RSI;
  char *in_RDI;
  Constraint *constraint;
  CgreenValue local_38;
  Constraint *local_20;
  size_t local_18;
  void *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pCVar1 = create_constraint();
  pCVar1->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;
  pCVar1->compare = compare_true;
  pCVar1->execute = capture_parameter;
  pCVar1->name = "capture parameter";
  local_20 = pCVar1;
  make_cgreen_pointer_value(&local_38,local_10);
  (pCVar1->expected_value).type = local_38.type;
  *(undefined4 *)&(pCVar1->expected_value).field_0x4 = local_38._4_4_;
  (pCVar1->expected_value).value = local_38.value;
  (pCVar1->expected_value).value_size = local_38.value_size;
  local_20->size_of_expected_value = local_18;
  local_20->parameter_name = local_8;
  return local_20;
}

Assistant:

Constraint *create_capture_parameter_constraint(const char *parameter_name, void *capture_to, size_t size_to_capture) {
    Constraint* constraint = create_constraint();
    constraint->type = CGREEN_CAPTURE_PARAMETER_CONSTRAINT;

    constraint->compare = &compare_true;
    constraint->execute = &capture_parameter;
    constraint->name = "capture parameter";
    constraint->expected_value = make_cgreen_pointer_value(capture_to);
    constraint->size_of_expected_value = size_to_capture;
    constraint->parameter_name = parameter_name;

    return constraint;
}